

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttributeType
          (HtmlparserCppTest *this,string *expected_attr_type)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  HtmlparserCppTest *pHVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar6;
  long lVar7;
  HtmlParser *this_00;
  const_iterator cVar8;
  mapped_type *ppHVar9;
  undefined8 extraout_RAX_02;
  undefined7 uVar11;
  HtmlparserCppTest *pHVar10;
  ulong uVar12;
  htmlparser_ctx *phVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  HtmlparserCppTest *pHVar16;
  HtmlparserCppTest *pHVar17;
  HtmlparserCppTest *pHVar18;
  htmlparser_ctx_s *phVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  pointer this_01;
  _Base_ptr unaff_R12;
  HtmlparserCppTest *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1a8;
  HtmlparserCppTest *pHStack_190;
  _Base_ptr p_Stack_188;
  undefined1 auStack_148 [16];
  _Base_ptr p_Stack_138;
  HtmlparserCppTest *pHStack_130;
  _Base_ptr p_Stack_128;
  undefined1 auStack_120 [16];
  _Base_ptr p_Stack_110;
  HtmlparserCppTest *pHStack_108;
  _Base_ptr p_Stack_100;
  char *pcStack_f8;
  HtmlParser HStack_f0;
  allocator aStack_b1;
  HtmlparserCppTest *pHStack_b0;
  size_t sStack_a8;
  HtmlparserCppTest HStack_a0;
  HtmlparserCppTest *pHStack_60;
  ulong uStack_58;
  string *psStack_48;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar10 = (HtmlparserCppTest *)(this->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar10);
  puVar14 = kAttributeTypeMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar10,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (expected_attr_type->_M_string_length == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar10 = (HtmlparserCppTest *)&local_30;
    std::__cxx11::string::string((string *)pHVar10,(char *)pHVar5,&local_31);
    sVar2 = expected_attr_type->_M_string_length;
    puVar14 = (undefined1 *)pHVar5;
    if (sVar2 == local_28) {
      uVar11 = (undefined7)((ulong)expected_attr_type >> 8);
      if (sVar2 == 0) {
        expected_attr_type = (string *)CONCAT71(uVar11,1);
      }
      else {
        pHVar10 = (HtmlparserCppTest *)(expected_attr_type->_M_dataplus)._M_p;
        puVar14 = (undefined1 *)local_30;
        iVar4 = bcmp(pHVar10,local_30,sVar2);
        expected_attr_type = (string *)CONCAT71(uVar11,iVar4 == 0);
      }
    }
    else {
      expected_attr_type = (string *)0x0;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      pHVar10 = local_30;
      operator_delete(local_30);
    }
    unaff_R14 = local_30;
    if ((char)expected_attr_type != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_58 = 0x10717a;
  psStack_48 = expected_attr_type;
  bVar3 = StringToBool((string *)puVar14);
  uVar12 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar19 = (pHVar10->parser_).parser_;
  uStack_58 = 0x107185;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar19);
  if (SUB81(uVar12,0) == (iVar4 != 0)) {
    return;
  }
  uStack_58 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_60 = pHVar10;
  uStack_58 = uVar12;
  bVar3 = StringToBool((string *)puVar14);
  phVar13 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var20 = *(_Base_ptr *)(phVar19 + 0x30);
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var20);
  if (SUB81(phVar13,0) == (iVar4 != 0)) {
    return;
  }
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar19;
  HStack_a0.parser_.parser_ = phVar13;
  bVar3 = StringToBool((string *)puVar14);
  p_Var21 = p_Var20[1]._M_left;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var21);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar10 = (HtmlparserCppTest *)p_Var21[1]._M_left;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var20;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar10);
  puVar15 = kJavascriptStateMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar10,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar10 = (HtmlparserCppTest *)&pHStack_b0;
    std::__cxx11::string::string((string *)pHVar10,(char *)pHVar5,&aStack_b1);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar15 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_a8) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        pHVar10 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl;
        puVar15 = (undefined1 *)pHStack_b0;
        iVar4 = bcmp(pHVar10,pHStack_b0,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_b0 != &HStack_a0) {
      pHVar10 = pHStack_b0;
      operator_delete(pHStack_b0);
    }
    unaff_R14 = pHStack_b0;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar15);
  pHVar5 = (HtmlparserCppTest *)(pHVar10->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar5);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar16 = (HtmlparserCppTest *)&pcStack_f8;
  pHVar18 = pHVar5;
  HStack_f0.parser_ = (htmlparser_ctx *)pHVar10;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar16 = (HtmlparserCppTest *)puVar15;
    p_Stack_100 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_100 = (_Base_ptr)0x1072dc;
    pcStack_f8 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar18 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    p_Stack_100 = (_Base_ptr)0x1072f8;
    unaff_R14 = (HtmlparserCppTest *)strtol((char *)pHVar18,&pcStack_f8,10);
    pHVar10 = pHVar5;
    puVar15 = (undefined1 *)pHVar16;
    unaff_R12 = (_Base_ptr)&pcStack_f8;
    if ((*pcStack_f8 != '\0') || (unaff_R12 = (_Base_ptr)&pcStack_f8, unaff_R15->_M_color != _S_red)
       ) goto LAB_00107324;
    pHVar18 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
    p_Stack_100 = (_Base_ptr)0x107313;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar18);
    unaff_R12 = (_Base_ptr)&pcStack_f8;
    if (iVar4 == (int)unaff_R14) {
      return;
    }
  }
  p_Stack_100 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  p_Stack_100 = unaff_R15;
  pHStack_108 = unaff_R14;
  p_Stack_110 = unaff_R12;
  auStack_120._8_8_ = pHVar10;
  pHVar17 = (HtmlparserCppTest *)auStack_120;
  auStack_120._0_8_ = extraout_RAX_00;
  pHVar5 = pHVar18;
  if (*(long *)&(pHVar16->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar17 = pHVar16;
    p_Stack_128 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_128 = (_Base_ptr)0x107348;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar5 = *(HtmlparserCppTest **)&(pHVar16->contextMap)._M_t._M_impl;
    p_Stack_128 = (_Base_ptr)0x107364;
    unaff_R14 = (HtmlparserCppTest *)strtol((char *)pHVar5,(char **)auStack_120,10);
    pHVar10 = pHVar18;
    pHVar16 = pHVar17;
    unaff_R12 = (_Base_ptr)auStack_120;
    if ((*(char *)auStack_120._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_120, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar5 = (HtmlparserCppTest *)(pHVar18->parser_).parser_;
    p_Stack_128 = (_Base_ptr)0x10737f;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar5);
    unaff_R12 = (_Base_ptr)auStack_120;
    if (iVar4 == (int)unaff_R14) {
      return;
    }
  }
  p_Stack_128 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  p_Stack_128 = unaff_R15;
  pHStack_130 = unaff_R14;
  p_Stack_138 = unaff_R12;
  auStack_148._8_8_ = pHVar10;
  pHVar18 = (HtmlparserCppTest *)auStack_148;
  auStack_148._0_8_ = extraout_RAX_01;
  pHVar10 = pHVar5;
  if (*(long *)&(pHVar17->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    piVar6 = __errno_location();
    *piVar6 = 0;
    pHVar10 = *(HtmlparserCppTest **)&(pHVar17->contextMap)._M_t._M_impl;
    lVar7 = strtol((char *)pHVar10,(char **)auStack_148,10);
    pHVar17 = pHVar18;
    unaff_R12 = (_Base_ptr)auStack_148;
    if ((*(char *)auStack_148._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_148, *piVar6 == 0))
    {
      pHVar10 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
      iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar10);
      unaff_R12 = (_Base_ptr)auStack_148;
      if (iVar4 == (int)lVar7) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar18 = pHVar17;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar3 = StringToBool((string *)pHVar18);
  pHVar5 = (HtmlparserCppTest *)(pHVar10->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar5);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_190 = pHVar10;
  p_Stack_188 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar18,"=",",",&vStack_1a8);
  if (vStack_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar5->parser_;
    p_Var1 = &(pHVar5->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1a8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar5,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar5,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar5,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar5,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar5,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar5,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar5,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar5,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar5,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar5,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar5,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar5,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar5,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar5,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar8 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar5,str);
                                    if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar9 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar5->contextMap,str);
                                      *ppHVar9 = this_00;
                                    }
                                    ppHVar9 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&pHVar5->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar9,source);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar8 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar5,str);
                                      if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1a8);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar9 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar5->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar9);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_00107851;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1a8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1a8);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateAttributeType(
    const string &expected_attr_type) {
  const char *parsed_attr_type = IdToName(kAttributeTypeMap,
                                          parser_.AttributeType());
  EXPECT_TRUE(parsed_attr_type != NULL);
  EXPECT_TRUE(!expected_attr_type.empty());
  EXPECT_EQ(expected_attr_type, string(parsed_attr_type))
      << "Unexpected attr_type value at line " << parser_.line_number();
}